

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,long begin,
          int param_4,long param_5,undefined8 param_6)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  pointer piVar4;
  size_type sVar5;
  int *piVar6;
  ulong uVar7;
  size_type sVar8;
  size_type sVar9;
  ulong uVar10;
  undefined8 uVar11;
  vector<int,_std::allocator<int>_> all_samples;
  allocator_type local_59;
  undefined8 local_58;
  _Vector_base<int,_std::allocator<int>_> local_50;
  long local_38;
  
  local_58 = param_6;
  if (begin - (long)this == 0) {
    assert_fail("local_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0xa9,"sample_block_decomp");
  }
  uVar10 = begin - (long)this >> 2;
  iVar1 = *(int *)(param_5 + 0x10);
  sVar8 = (size_type)param_4;
  local_38 = param_5;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,sVar8,(allocator_type *)&local_50);
  lVar3 = local_38;
  uVar11 = local_58;
  piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (uVar7 = 0; (long)piVar2 - (long)piVar4 >> 2 != uVar7; uVar7 = uVar7 + 1) {
    this = this + (uVar10 / (ulong)(long)(param_4 + 1) +
                  (ulong)(uVar7 < uVar10 % (ulong)(long)(param_4 + 1))) * 4;
    piVar4[uVar7] = *(int *)(this + -4);
  }
  if (*(int *)(local_38 + 0x14) == 0) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_50,(long)(iVar1 * param_4),&local_59);
    uVar11 = local_58;
    MPI_Gather((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,param_4,local_58,
               local_50._M_impl.super__Vector_impl_data._M_start,param_4,local_58,0,
               *(undefined8 *)(lVar3 + 8));
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
              (local_50._M_impl.super__Vector_impl_data._M_start);
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar5 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
    sVar9 = (long)iVar1 - 1;
    if (sVar5 != sVar9) {
      std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,sVar9);
      piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
    }
    piVar6 = local_50._M_impl.super__Vector_impl_data._M_start + (sVar8 - 1);
    for (sVar9 = 0; sVar5 != sVar9; sVar9 = sVar9 + 1) {
      piVar4[sVar9] = *piVar6;
      piVar6 = piVar6 + sVar8;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  }
  else {
    MPI_Gather(piVar4,param_4,local_58,0,0,local_58,0,*(undefined8 *)(local_38 + 8));
    sVar8 = (long)iVar1 - 1;
    if ((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 != sVar8) {
      std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,sVar8);
    }
  }
  piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  MPI_Bcast(piVar4,(ulong)((long)(__return_storage_ptr__->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar4) >> 2,uVar11,0,
            *(undefined8 *)(lVar3 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt)
{
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);
    int p = comm.size();

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (std::size_t i = 0; i < local_splitters.size(); ++i) {
        std::size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    if (comm.rank() == 0) {
        std::vector<value_type> all_samples(p*s);
        MPI_Gather(&local_splitters[0], s, mpi_dt,
                   &all_samples[0], s, mpi_dt, 0, comm);

        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }
    else
    {
        // simply send
        MPI_Gather(&local_splitters[0], s, mpi_dt, NULL, 0, mpi_dt, 0, comm);

        // resize splitters for receiving
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}